

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

bool __thiscall
metaf::VisibilityGroup::appendVariableMaxFraction
          (VisibilityGroup *this,string *group,IncompleteText next)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar4 = group->_M_string_length;
  uVar3 = std::__cxx11::string::find((char)group,0x2f);
  if (uVar3 - 3 < 0xfffffffffffffffe) {
    return false;
  }
  uVar5 = uVar4 - (uVar3 + 1);
  if (uVar5 < 3 && uVar4 != uVar3 + 1) {
    uVar9 = group->_M_string_length;
    uVar7 = 0;
    if (uVar3 <= uVar9 && uVar9 != 0) {
      uVar8 = 0x100000000;
      lVar10 = 0;
      do {
        cVar1 = (group->_M_dataplus)._M_p[lVar10];
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          uVar6 = 0;
          uVar8 = 0;
          break;
        }
        uVar6 = (uint)(byte)(cVar1 - 0x30) + (int)uVar7 * 10;
        uVar7 = (ulong)uVar6;
        lVar10 = lVar10 + 1;
      } while ((uint)lVar10 < (uint)uVar3);
      uVar7 = uVar6 | uVar8;
    }
    uVar6 = 0;
    if (uVar9 < uVar4 || uVar9 == 0) {
      return false;
    }
    uVar4 = 1;
    do {
      cVar1 = (group->_M_dataplus)._M_p[uVar4 + uVar3];
      if ((byte)(cVar1 - 0x3aU) < 0xf6) {
        return false;
      }
      uVar6 = (uint)(byte)(cVar1 - 0x30) + uVar6 * 10;
      uVar9 = uVar4 & 0xffffffff;
      uVar4 = uVar4 + 1;
    } while (uVar9 < uVar5);
    if (uVar7 >> 0x20 == 0) {
      return false;
    }
    if (uVar6 == 0) {
      return false;
    }
    uVar4 = (ulong)(uint)((int)uVar7 * 10000) / (ulong)uVar6;
    if (MORE_THAN < (this->visMax).distModifier) {
      return false;
    }
    if ((this->visMax).distUnit != STATUTE_MILES) {
      return false;
    }
    if ((this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      uVar6 = (this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value;
      if (0x68db8 < (uVar6 * 0x3afb7e91 >> 4 | uVar6 * 0x10000000)) {
        return false;
      }
      iVar2 = (int)uVar4;
      if (iVar2 != (int)(uVar4 / 10000) * 10000) {
        (this->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)((ulong)(uVar6 + iVar2) | 0x100000000);
        (this->visMax).distUnit = STATUTE_MILES;
        this->incompleteText = next;
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool VisibilityGroup::appendVariableMaxFraction(const std::string & group, IncompleteText next) {
	const auto fraction = fractionStrToUint(group, 0, group.length());
	if (!fraction.has_value()) return false;
	const auto numerator = std::get<0>(*fraction);
	const auto denominator = std::get<1>(*fraction);
	const auto v = Distance(numerator, denominator);
	if (!v.isValue()) return false;
	const auto t = Distance::fromIntegerAndFraction(visMax, v);
	if (!t.has_value()) return false;
	visMax = *t;
	incompleteText = next;
	return true;
}